

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

void __thiscall hnsw::Matrix::Matrix(Matrix *this,float *data_ptr,size_t n_rows,size_t n_cols)

{
  long lVar1;
  bool bVar2;
  float *local_38;
  
  (this->row_ptrs_).super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = 0;
  (this->row_ptrs_).super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ptrs_).super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->data_ = data_ptr;
  this->rows_ = n_rows;
  this->cols_ = n_cols;
  while (bVar2 = n_rows != 0, n_rows = n_rows - 1, bVar2) {
    local_38 = (float *)((long)this->data_ + lVar1);
    std::vector<float_const*,std::allocator<float_const*>>::emplace_back<float_const*>
              ((vector<float_const*,std::allocator<float_const*>> *)&this->row_ptrs_,&local_38);
    lVar1 = lVar1 + n_cols * 4;
  }
  return;
}

Assistant:

explicit Matrix(const float *data_ptr, size_t n_rows, size_t n_cols) {
    data_ = data_ptr;
    rows_ = n_rows;
    cols_ = n_cols;
    for (size_t i = 0; i < n_rows; i++) {
      row_ptrs_.push_back(data_ + i * n_cols);
    }
  }